

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O1

uint LocaleIndependentAtoi<unsigned_int>(string_view str)

{
  uint uVar1;
  void *pvVar2;
  size_type sVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<unsigned_int> _Var8;
  uint result;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  long local_30;
  
  pcVar5 = str._M_str;
  uVar7 = str._M_len;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0xffffffffffffffff;
  local_40._M_len = uVar7;
  local_40._M_str = pcVar5;
  if (uVar7 != 0) {
    uVar6 = 0;
    do {
      pvVar2 = memchr(" \f\n\r\t\v",(int)pcVar5[uVar6],6);
      uVar4 = uVar6;
      if (pvVar2 == (void *)0x0) break;
      uVar6 = uVar6 + 1;
      uVar4 = 0xffffffffffffffff;
    } while (uVar7 != uVar6);
  }
  if (uVar4 == 0xffffffffffffffff) {
    uVar7 = 0;
    pcVar5 = (char *)0x0;
  }
  else {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                      (&local_40," \f\n\r\t\v",0xffffffffffffffff,6);
    if (local_40._M_len < uVar4) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar4);
      }
      goto LAB_0075e33f;
    }
    uVar7 = (sVar3 - uVar4) + 1;
    if (local_40._M_len - uVar4 < uVar7) {
      uVar7 = local_40._M_len - uVar4;
    }
    pcVar5 = local_40._M_str + uVar4;
  }
  if ((uVar7 == 0) || (*pcVar5 != '+')) {
LAB_0075e2c3:
    _Var8 = std::from_chars<unsigned_int>(pcVar5,pcVar5 + uVar7,(uint *)&local_40,10);
    if (_Var8.ec == 0) {
      uVar1 = (uint)local_40._M_len;
    }
    else {
      uVar1 = 0;
      if ((_Var8.ec == result_out_of_range) && ((uVar7 == 0 || (*pcVar5 != '-')))) {
        uVar1 = 0xffffffff;
      }
    }
  }
  else if ((uVar7 == 1) || (uVar1 = 0, pcVar5[1] != '-')) {
    uVar7 = uVar7 - 1;
    pcVar5 = pcVar5 + 1;
    goto LAB_0075e2c3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar1;
  }
LAB_0075e33f:
  __stack_chk_fail();
}

Assistant:

T LocaleIndependentAtoi(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    // Emulate atoi(...) handling of white space and leading +/-.
    std::string_view s = util::TrimStringView(str);
    if (!s.empty() && s[0] == '+') {
        if (s.length() >= 2 && s[1] == '-') {
            return 0;
        }
        s = s.substr(1);
    }
    auto [_, error_condition] = std::from_chars(s.data(), s.data() + s.size(), result);
    if (error_condition == std::errc::result_out_of_range) {
        if (s.length() >= 1 && s[0] == '-') {
            // Saturate underflow, per strtoll's behavior.
            return std::numeric_limits<T>::min();
        } else {
            // Saturate overflow, per strtoll's behavior.
            return std::numeric_limits<T>::max();
        }
    } else if (error_condition != std::errc{}) {
        return 0;
    }
    return result;
}